

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

void __thiscall
spirv_cross::CompilerGLSL::emit_uninitialized_temporary
          (CompilerGLSL *this,uint32_t result_type,uint32_t result_id)

{
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *this_00;
  pair<spirv_cross::TypedID<(spirv_cross::Types)1>,_spirv_cross::TypedID<(spirv_cross::Types)0>_>
  *ppVar1;
  size_t sVar2;
  bool bVar3;
  size_type sVar4;
  SPIRType *type;
  Bitset *flags;
  SPIRBlock *pSVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  pair<spirv_cross::TypedID<(spirv_cross::Types)1>,_spirv_cross::TypedID<(spirv_cross::Types)0>_>
  *ppVar6;
  long lVar7;
  long lVar8;
  pair<spirv_cross::TypedID<(spirv_cross::Types)1>,_spirv_cross::TypedID<(spirv_cross::Types)0>_>
  *ppVar9;
  uint32_t result_id_local;
  uint32_t result_type_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  string local_88;
  string initializer;
  string local_48 [32];
  
  result_id_local = result_id;
  result_type_local = result_type;
  if ((this->block_temporary_hoisting != false) ||
     (this->current_continue_block == (SPIRBlock *)0x0)) {
LAB_00256448:
    sVar4 = ::std::
            _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::count(&(this->super_Compiler).hoisted_temporaries._M_h,&result_id_local);
    if (sVar4 == 0) {
      type = Compiler::get<spirv_cross::SPIRType>(&this->super_Compiler,result_type);
      flags = Compiler::get_decoration_bitset(&this->super_Compiler,(ID)result_id_local);
      add_local_variable_name(this,result_id_local);
      initializer._M_dataplus._M_p = (pointer)&initializer.field_2;
      initializer._M_string_length = 0;
      initializer.field_2._M_local_buf[0] = '\0';
      if (((this->options).force_zero_initialized_variables == true) &&
         (bVar3 = type_can_zero_initialize(this,type), bVar3)) {
        (*(this->super_Compiler)._vptr_Compiler[0x37])(&local_a8,this,result_type);
        join<char_const(&)[4],std::__cxx11::string>
                  (&local_88,(spirv_cross *)0x395f16,(char (*) [4])&local_a8,in_RCX);
        ::std::__cxx11::string::operator=((string *)&initializer,(string *)&local_88);
        ::std::__cxx11::string::~string((string *)&local_88);
        ::std::__cxx11::string::~string((string *)&local_a8);
      }
      flags_to_qualifiers_glsl_abi_cxx11_(&local_88,this,type,flags);
      (*(this->super_Compiler)._vptr_Compiler[6])(local_48,this,(ulong)result_id_local,1);
      (*(this->super_Compiler)._vptr_Compiler[0x1b])(&local_a8,this,type,local_48,0);
      statement<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string&,char_const(&)[2]>
                (this,&local_88,&local_a8,&initializer,(char (*) [2])0x37e4df);
      ::std::__cxx11::string::~string((string *)&local_a8);
      ::std::__cxx11::string::~string(local_48);
      ::std::__cxx11::string::~string((string *)&local_88);
      ::std::__cxx11::string::~string((string *)&initializer);
    }
    return;
  }
  this_00 = &(this->super_Compiler).hoisted_temporaries;
  sVar4 = ::std::
          _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::count(&this_00->_M_h,&result_id_local);
  if (sVar4 != 0) goto LAB_00256448;
  pSVar5 = Compiler::get<spirv_cross::SPIRBlock>
                     (&this->super_Compiler,(this->current_continue_block->loop_dominator).id);
  ppVar1 = (pSVar5->declare_temporary).
           super_VectorView<std::pair<spirv_cross::TypedID<(spirv_cross::Types)1>,_spirv_cross::TypedID<(spirv_cross::Types)0>_>_>
           .ptr;
  sVar2 = (pSVar5->declare_temporary).
          super_VectorView<std::pair<spirv_cross::TypedID<(spirv_cross::Types)1>,_spirv_cross::TypedID<(spirv_cross::Types)0>_>_>
          .buffer_size;
  ppVar6 = ppVar1 + 2;
  lVar7 = sVar2 << 3;
  for (lVar8 = (long)sVar2 >> 2; 0 < lVar8; lVar8 = lVar8 + -1) {
    if ((ppVar6[-2].first.id == result_type) && (ppVar6[-2].second.id == result_id_local)) {
      ppVar9 = ppVar6 + -2;
      goto LAB_00256643;
    }
    if ((ppVar6[-1].first.id == result_type) && (ppVar6[-1].second.id == result_id_local)) {
      ppVar9 = ppVar6 + -1;
      goto LAB_00256643;
    }
    if (((ppVar6->first).id == result_type) &&
       (ppVar9 = ppVar6, (ppVar6->second).id == result_id_local)) goto LAB_00256643;
    if ((ppVar6[1].first.id == result_type) && (ppVar6[1].second.id == result_id_local)) {
      ppVar9 = ppVar6 + 1;
      goto LAB_00256643;
    }
    ppVar6 = ppVar6 + 4;
    lVar7 = lVar7 + -0x20;
  }
  lVar7 = lVar7 >> 3;
  ppVar9 = ppVar6 + -2;
  if (lVar7 == 1) {
LAB_00256696:
    if (((ppVar9->first).id != result_type) || ((ppVar9->second).id != result_id_local))
    goto LAB_0025664c;
  }
  else if (lVar7 == 3) {
    if ((ppVar6[-2].first.id != result_type) || (ppVar6[-2].second.id != result_id_local)) {
      ppVar9 = ppVar6 + -1;
      goto LAB_00256687;
    }
  }
  else {
    if (lVar7 != 2) goto LAB_0025664c;
LAB_00256687:
    if (((ppVar9->first).id != result_type) || ((ppVar9->second).id != result_id_local)) {
      ppVar9 = ppVar9 + 1;
      goto LAB_00256696;
    }
  }
LAB_00256643:
  if (ppVar9 != ppVar1 + sVar2) {
    return;
  }
LAB_0025664c:
  SmallVector<std::pair<spirv_cross::TypedID<(spirv_cross::Types)1>,spirv_cross::TypedID<(spirv_cross::Types)0>>,8ul>
  ::emplace_back<unsigned_int&,unsigned_int&>
            ((SmallVector<std::pair<spirv_cross::TypedID<(spirv_cross::Types)1>,spirv_cross::TypedID<(spirv_cross::Types)0>>,8ul>
              *)&pSVar5->declare_temporary,&result_type_local,&result_id_local);
  ::std::__detail::
  _Insert_base<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::insert((_Insert_base<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            *)this_00,&result_id_local);
  Compiler::force_recompile(&this->super_Compiler);
  return;
}

Assistant:

void CompilerGLSL::emit_uninitialized_temporary(uint32_t result_type, uint32_t result_id)
{
	// If we're declaring temporaries inside continue blocks,
	// we must declare the temporary in the loop header so that the continue block can avoid declaring new variables.
	if (!block_temporary_hoisting && current_continue_block && !hoisted_temporaries.count(result_id))
	{
		auto &header = get<SPIRBlock>(current_continue_block->loop_dominator);
		if (find_if(begin(header.declare_temporary), end(header.declare_temporary),
		            [result_type, result_id](const pair<uint32_t, uint32_t> &tmp) {
			            return tmp.first == result_type && tmp.second == result_id;
		            }) == end(header.declare_temporary))
		{
			header.declare_temporary.emplace_back(result_type, result_id);
			hoisted_temporaries.insert(result_id);
			force_recompile();
		}
	}
	else if (hoisted_temporaries.count(result_id) == 0)
	{
		auto &type = get<SPIRType>(result_type);
		auto &flags = get_decoration_bitset(result_id);

		// The result_id has not been made into an expression yet, so use flags interface.
		add_local_variable_name(result_id);

		string initializer;
		if (options.force_zero_initialized_variables && type_can_zero_initialize(type))
			initializer = join(" = ", to_zero_initialized_expression(result_type));

		statement(flags_to_qualifiers_glsl(type, flags), variable_decl(type, to_name(result_id)), initializer, ";");
	}
}